

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_convert_float.c
# Opt level: O3

int mpt_data_convert_float64(double *from,mpt_type_t type,void *dest)

{
  int iVar1;
  double dVar2;
  
  if (from == (double *)0x0) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = *from;
  }
  iVar1 = -3;
  if ((long)type < 0x65) {
    if (type == 0x44) {
      iVar1 = 0x10;
      if (dest != (void *)0x0) {
        *(double **)dest = from;
        *(undefined8 *)((long)dest + 8) = 8;
      }
    }
    else if ((type == 100) && (iVar1 = 8, dest != (void *)0x0)) {
      *(double *)dest = dVar2;
      return 8;
    }
  }
  else if (type == 0x65) {
    iVar1 = 0x10;
    if (dest != (void *)0x0) {
      *(longdouble *)dest = (longdouble)dVar2;
      return iVar1;
    }
  }
  else if ((type == 0x66) && (iVar1 = 4, dest != (void *)0x0)) {
    *(float *)dest = (float)dVar2;
    return 4;
  }
  return iVar1;
}

Assistant:

extern int mpt_data_convert_float64(const double *from, MPT_TYPE(type) type, void *dest)
{
	double val = 0.0;
	if (from) {
		val = *from;
	}
	switch (type) {
		case 'f':
			if (dest) *((float *) dest) = val;
			return sizeof(float);
		case 'd':
			if (dest) *((double *) dest) = val;
			return sizeof(double);
#ifdef _MPT_FLOAT_EXTENDED_H
		case 'e':
			if (dest) *((long double *) dest) = val;
			return sizeof(long double);
#endif
		case MPT_type_toVector('d'):
			if (dest) {
				struct iovec *vec = dest;
				vec->iov_base = (void *) from;
				vec->iov_len  = sizeof(*from);
			}
			return sizeof(struct iovec);
		default: return MPT_ERROR(BadType); /* invalid conversion */
	}
}